

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O2

void Timidity::PrintDLS(DLS_Data *data)

{
  DLS_Region *pDVar1;
  DLS_Instrument *pDVar2;
  DLS_Region *pDVar3;
  RGNHEADER *pRVar4;
  WLOOP *pWVar5;
  CONNECTIONLIST *pCVar6;
  DLS_Wave *pDVar7;
  WaveFMT *pWVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  puts("DLS Data:");
  printf("cInstruments = %u\n");
  if (data->instruments != (DLS_Instrument *)0x0) {
    for (uVar11 = 0; uVar11 < data->cInstruments; uVar11 = uVar11 + 1) {
      pDVar2 = data->instruments;
      printf("Instrument %u:\n");
      if (pDVar2[uVar11].name != (char *)0x0) {
        printf("  Name: %s\n");
      }
      if (pDVar2[uVar11].header != (INSTHEADER *)0x0) {
        printf("  ulBank = 0x%8.8x\n",(ulong)((pDVar2[uVar11].header)->Locale).ulBank);
        printf("  ulInstrument = %u\n",(ulong)((pDVar2[uVar11].header)->Locale).ulInstrument);
        printf("  Regions: %u\n");
        for (uVar10 = 0; uVar10 < (pDVar2[uVar11].header)->cRegions; uVar10 = uVar10 + 1) {
          pDVar3 = pDVar2[uVar11].regions;
          pDVar1 = pDVar3 + uVar10;
          printf("  Region %u:\n");
          pRVar4 = pDVar3[uVar10].header;
          if (pRVar4 != (RGNHEADER *)0x0) {
            printf("    RangeKey = { %hu - %hu }\n",(ulong)(pRVar4->RangeKey).usLow,
                   (ulong)(pRVar4->RangeKey).usHigh);
            printf("    RangeVelocity = { %hu - %hu }\n",
                   (ulong)(pDVar1->header->RangeVelocity).usLow,
                   (ulong)(pDVar1->header->RangeVelocity).usHigh);
            printf("    fusOptions = 0x%4.4hx\n",(ulong)pDVar1->header->fusOptions);
            printf("    usKeyGroup = %hu\n",(ulong)pDVar1->header->usKeyGroup);
          }
          if (pDVar1->wlnk != (WAVELINK *)0x0) {
            printf("    wlnk->fusOptions = 0x%4.4hx\n",(ulong)pDVar1->wlnk->fusOptions);
            printf("    wlnk->usPhaseGroup = %hu\n",(ulong)pDVar1->wlnk->usPhaseGroup);
            printf("    wlnk->ulChannel = %u\n",(ulong)pDVar1->wlnk->ulChannel);
            printf("    wlnk->ulTableIndex = %u\n",(ulong)pDVar1->wlnk->ulTableIndex);
          }
          if (pDVar1->wsmp != (WSMPL *)0x0) {
            printf("    wsmp->usUnityNote = %hu\n",(ulong)pDVar1->wsmp->usUnityNote);
            printf("    wsmp->sFineTune = %hd\n",(ulong)(uint)(int)pDVar1->wsmp->sFineTune);
            printf("    wsmp->lAttenuation = %d\n",(ulong)(uint)pDVar1->wsmp->lAttenuation);
            printf("    wsmp->fulOptions = 0x%8.8x\n",(ulong)pDVar1->wsmp->fulOptions);
            printf("    wsmp->cSampleLoops = %u\n",(ulong)pDVar1->wsmp->cSampleLoops);
            lVar9 = 0xc;
            for (uVar12 = 0; uVar12 < pDVar1->wsmp->cSampleLoops; uVar12 = uVar12 + 1) {
              pWVar5 = pDVar1->wsmp_loop;
              printf("    Loop %u:\n",uVar12 & 0xffffffff);
              printf("      ulStart = %u\n",(ulong)*(uint *)((long)pWVar5 + lVar9 + -4));
              printf("      ulLength = %u\n",(ulong)*(uint *)((long)&pWVar5->cbSize + lVar9));
              lVar9 = lVar9 + 0x10;
            }
          }
          pCVar6 = pDVar1->art;
          if ((pCVar6 != (CONNECTIONLIST *)0x0) && (pCVar6->cConnections != 0)) {
            PrintArt("Region",pCVar6,pDVar1->artList);
          }
        }
      }
      pCVar6 = pDVar2[uVar11].art;
      if ((pCVar6 != (CONNECTIONLIST *)0x0) && (pCVar6->cConnections != 0)) {
        PrintArt("Instrument",pCVar6,pDVar2[uVar11].artList);
      }
    }
  }
  if ((data->ptbl != (POOLTABLE *)0x0) && (data->ptbl->cCues != 0)) {
    printf("Cues: ");
    for (uVar11 = 0; uVar11 < data->ptbl->cCues; uVar11 = uVar11 + 1) {
      if (uVar11 != 0) {
        printf(", ");
      }
      printf("%u",(ulong)data->ptblList[uVar11].ulOffset);
    }
    putchar(10);
  }
  if ((data->waveList != (DLS_Wave *)0x0) && (data->ptbl != (POOLTABLE *)0x0)) {
    puts("Waves:");
    for (uVar11 = 0; uVar11 < data->ptbl->cCues; uVar11 = uVar11 + 1) {
      pDVar7 = data->waveList;
      pWVar8 = pDVar7[uVar11].format;
      if (pWVar8 != (WaveFMT *)0x0) {
        printf("  Wave %u: Format: %hu, %hu channels, %u Hz, %hu bits (length = %u)\n",
               uVar11 & 0xffffffff,(ulong)pWVar8->wFormatTag,(ulong)pWVar8->wChannels,
               (ulong)pWVar8->dwSamplesPerSec,(ulong)pWVar8->wBitsPerSample,pDVar7[uVar11].length);
      }
      if (pDVar7[uVar11].wsmp != (WSMPL *)0x0) {
        printf("    wsmp->usUnityNote = %hu\n",(ulong)(pDVar7[uVar11].wsmp)->usUnityNote);
        printf("    wsmp->sFineTune = %hd\n",(ulong)(uint)(int)(pDVar7[uVar11].wsmp)->sFineTune);
        printf("    wsmp->lAttenuation = %d\n",(ulong)(uint)(pDVar7[uVar11].wsmp)->lAttenuation);
        printf("    wsmp->fulOptions = 0x%8.8x\n",(ulong)(pDVar7[uVar11].wsmp)->fulOptions);
        printf("    wsmp->cSampleLoops = %u\n",(ulong)(pDVar7[uVar11].wsmp)->cSampleLoops);
        lVar9 = 0xc;
        for (uVar10 = 0; uVar10 < (pDVar7[uVar11].wsmp)->cSampleLoops; uVar10 = uVar10 + 1) {
          pWVar5 = pDVar7[uVar11].wsmp_loop;
          printf("    Loop %u:\n",uVar10 & 0xffffffff);
          printf("      ulStart = %u\n",(ulong)*(uint *)((long)pWVar5 + lVar9 + -4));
          printf("      ulLength = %u\n",(ulong)*(uint *)((long)&pWVar5->cbSize + lVar9));
          lVar9 = lVar9 + 0x10;
        }
      }
    }
  }
  if (data->name != (char *)0x0) {
    printf("Name: %s\n");
  }
  if (data->artist != (char *)0x0) {
    printf("Artist: %s\n");
  }
  if (data->copyright != (char *)0x0) {
    printf("Copyright: %s\n");
  }
  if (data->comments != (char *)0x0) {
    printf("Comments: %s\n");
    return;
  }
  return;
}

Assistant:

void PrintDLS(DLS_Data *data)
{
	printf("DLS Data:\n");
	printf("cInstruments = %u\n", data->cInstruments); 
	if ( data->instruments ) {
		DWORD i;
		for ( i = 0; i < data->cInstruments; ++i ) {
			PrintInstrument(&data->instruments[i], i);
		}
	}
	if ( data->ptbl && data->ptbl->cCues > 0 ) {
		DWORD i;
		printf("Cues: ");
		for ( i = 0; i < data->ptbl->cCues; ++i ) {
			if ( i > 0 ) {
				printf(", ");
			}
			printf("%u", data->ptblList[i].ulOffset);
		}
		printf("\n");
	}
	if ( data->waveList && data->ptbl ) {
		DWORD i;
		printf("Waves:\n");
		for ( i = 0; i < data->ptbl->cCues; ++i ) {
			PrintWave(&data->waveList[i], i);
		}
	}
	if ( data->name ) {
		printf("Name: %s\n", data->name);
	}
	if ( data->artist ) {
		printf("Artist: %s\n", data->artist);
	}
	if ( data->copyright ) {
		printf("Copyright: %s\n", data->copyright);
	}
	if ( data->comments ) {
		printf("Comments: %s\n", data->comments);
	}
}